

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::GetPropertyDescriptorTrap
          (JavascriptProxy *this,PropertyId propertyId,PropertyDescriptor *resultDescriptor,
          ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_40_5_440632d1 implicitCall;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  BOOL BVar5;
  BOOL BVar6;
  ScriptContext *pSVar7;
  ThreadContext *pTVar8;
  RecyclableObject *pRVar9;
  RecyclableObject *obj;
  DynamicType *pDVar10;
  DynamicTypeHandler *pDVar11;
  undefined4 *puVar12;
  JavascriptFunction *function;
  Var pvVar13;
  PropertyDescriptor *local_110;
  BOOL toProperty;
  BOOL isTargetExtensible;
  BOOL hasProperty;
  PropertyDescriptor targetDescriptor;
  TypeId getResultTypeId;
  Var getResult;
  Var propertyName;
  JavascriptFunction *gOPDMethod;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  ThreadContext *threadContext;
  ScriptContext *requestContext_local;
  PropertyDescriptor *resultDescriptor_local;
  PropertyId propertyId_local;
  JavascriptProxy *this_local;
  TypeId local_18;
  TypeId typeId;
  
  pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  pTVar8 = ScriptContext::GetThreadContext(pSVar7);
  pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ThreadContext::ProbeStack(pTVar8,0xc00,pSVar7,(PVOID)0x0);
  pTVar8 = ScriptContext::GetThreadContext(requestContext);
  bVar2 = ThreadContext::IsDisableImplicitCall(pTVar8);
  if (bVar2) {
    ThreadContext::AddImplicitCallFlags(pTVar8,ImplicitCall_External);
    this_local._4_4_ = 0;
  }
  else {
    pRVar9 = MarshalHandler(this,requestContext);
    if (pRVar9 == (RecyclableObject *)0x0) {
      bVar2 = ThreadContext::RecordImplicitException(pTVar8);
      if (bVar2) {
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"getOwnPropertyDescriptor");
      }
      this_local._4_4_ = 0;
    }
    else {
      obj = MarshalTarget(this,requestContext);
      pDVar10 = (DynamicType *)RecyclableObject::GetType((RecyclableObject *)this);
      pDVar11 = DynamicType::GetTypeHandler(pDVar10);
      iVar3 = (*pDVar11->_vptr_DynamicTypeHandler[6])();
      if (iVar3 != 0) {
        pDVar10 = (DynamicType *)RecyclableObject::GetType((RecyclableObject *)this);
        pDVar11 = DynamicType::GetTypeHandler(pDVar10);
        pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        iVar3 = (*pDVar11->_vptr_DynamicTypeHandler[9])(pDVar11,pSVar7,0);
        if (iVar3 != 7) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0xdc,
                                      "((static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 || (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap)"
                                      ,
                                      "(static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 || (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar12 = 0;
        }
      }
      function = GetMethodHelper(this,0xa4,requestContext);
      if (function != (JavascriptFunction *)0x0) {
        pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
        bVar2 = ScriptContext::IsHeapEnumInProgress(pSVar7);
        if (!bVar2) {
          pvVar13 = GetName(requestContext,propertyId);
          bVar2 = VarIs<Js::JavascriptString>(pvVar13);
          if ((!bVar2) && (bVar2 = VarIs<Js::JavascriptSymbol>(pvVar13), !bVar2)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0xea,
                                        "(VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName))"
                                        ,
                                        "VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName)"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          implicitCall.gOPDMethod = function;
          implicitCall.threadContext = pTVar8;
          implicitCall.handlerObj = pRVar9;
          implicitCall.targetObj = obj;
          implicitCall.propertyName = pvVar13;
          pvVar13 = ThreadContext::
                    ExecuteImplicitCall<Js::JavascriptProxy::GetPropertyDescriptorTrap(int,Js::PropertyDescriptor*,Js::ScriptContext*)::__0>
                              (pTVar8,(RecyclableObject *)function,ImplicitCall_Accessor,
                               implicitCall);
          if (pvVar13 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar12 = 0;
          }
          bVar2 = TaggedInt::Is(pvVar13);
          if (bVar2) {
            local_18 = TypeIds_FirstNumberType;
          }
          else {
            bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar13);
            if (bVar2) {
              local_18 = TypeIds_Number;
            }
            else {
              pRVar9 = UnsafeVarTo<Js::RecyclableObject>(pvVar13);
              if (pRVar9 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
              local_18 = RecyclableObject::GetTypeId(pRVar9);
              if ((0x57 < (int)local_18) &&
                 (BVar4 = RecyclableObject::IsExternal(pRVar9), BVar4 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar12 = 0;
              }
            }
          }
          targetDescriptor._44_4_ = local_18;
          bVar2 = StaticType::Is(local_18);
          if ((bVar2) && (targetDescriptor._44_4_ != 0)) {
            JavascriptError::ThrowTypeError(requestContext,-0x7ff5ec71,L"getOwnPropertyDescriptor");
          }
          PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&isTargetExtensible);
          BVar4 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                            (obj,propertyId,requestContext,(PropertyDescriptor *)&isTargetExtensible
                            );
          if (targetDescriptor._44_4_ != 0) {
            iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x33])();
            BVar5 = Js::JavascriptOperators::ToPropertyDescriptor
                              (pvVar13,resultDescriptor,requestContext);
            if ((BVar5 == 0) && (iVar3 != 0)) {
              JavascriptError::ThrowTypeError
                        (requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
            }
            Js::JavascriptOperators::CompletePropertyDescriptor
                      (resultDescriptor,(PropertyDescriptor *)0x0,requestContext);
            if (BVar4 == 0) {
              local_110 = (PropertyDescriptor *)0x0;
            }
            else {
              local_110 = (PropertyDescriptor *)&isTargetExtensible;
            }
            BVar6 = Js::JavascriptOperators::IsCompatiblePropertyDescriptor
                              (resultDescriptor,local_110,iVar3 != 0,true,requestContext);
            if (BVar6 != 0) {
              bVar2 = PropertyDescriptor::IsConfigurable(resultDescriptor);
              if ((!bVar2) &&
                 ((BVar4 == 0 ||
                  (bVar2 = PropertyDescriptor::IsConfigurable
                                     ((PropertyDescriptor *)&isTargetExtensible), bVar2)))) {
                JavascriptError::ThrowTypeError
                          (requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
              }
              PropertyDescriptor::SetFromProxy(resultDescriptor,true);
              return BVar5;
            }
            JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
          }
          if (BVar4 == 0) {
            return 0;
          }
          bVar2 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&isTargetExtensible);
          if (bVar2) {
            iVar3 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x33])();
            if (iVar3 != 0) {
              return 0;
            }
            JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
          }
          JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
        }
      }
      PropertyDescriptor::SetFromProxy(resultDescriptor,false);
      this_local._4_4_ =
           Js::JavascriptOperators::GetOwnPropertyDescriptor
                     (obj,propertyId,requestContext,resultDescriptor);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::GetPropertyDescriptorTrap(PropertyId propertyId, PropertyDescriptor* resultDescriptor, ScriptContext* requestContext)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //2. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("getOwnPropertyDescriptor"));
        }
        //3. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        Assert((static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 ||
            (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap);

        JavascriptFunction* gOPDMethod = GetMethodHelper(PropertyIds::getOwnPropertyDescriptor, requestContext);

        //7. If trap is undefined, then
        //    a.Return the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        if (nullptr == gOPDMethod || GetScriptContext()->IsHeapEnumInProgress())
        {
            resultDescriptor->SetFromProxy(false);
            return JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, resultDescriptor);
        }

        Var propertyName = GetName(requestContext, propertyId);

        Assert(VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName));
        //8. Let trapResultObj be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and P.
        //9. ReturnIfAbrupt(trapResultObj).
        //10. If Type(trapResultObj) is neither Object nor Undefined, then throw a TypeError exception.

        Var getResult = threadContext->ExecuteImplicitCall(gOPDMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, gOPDMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, propertyName);
        });

        TypeId getResultTypeId = JavascriptOperators::GetTypeId(getResult);
        if (StaticType::Is(getResultTypeId) && getResultTypeId != TypeIds_Undefined)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_NeedObject, _u("getOwnPropertyDescriptor"));
        }
        //11. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //12. ReturnIfAbrupt(targetDesc).
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);

        //13. If trapResultObj is undefined, then
        //a.If targetDesc is undefined, then return undefined.
        //b.If targetDesc.[[Configurable]] is false, then throw a TypeError exception.
        //c.Let extensibleTarget be the result of IsExtensible(target).
        //d.ReturnIfAbrupt(extensibleTarget).
        //e.If ToBoolean(extensibleTarget) is false, then throw a TypeError exception.
        //f.Return undefined.
        if (getResultTypeId == TypeIds_Undefined)
        {
            if (!hasProperty)
            {
                return FALSE;
            }
            if (!targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }

            // do not use "target" here, the trap may have caused it to change
            if (!targetObj->IsExtensible())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }

            return FALSE;
        }

        //14. Let extensibleTarget be the result of IsExtensible(target).
        //15. ReturnIfAbrupt(extensibleTarget).
        //16. Let resultDesc be ToPropertyDescriptor(trapResultObj).
        //17. ReturnIfAbrupt(resultDesc).
        //18. Call CompletePropertyDescriptor(resultDesc, targetDesc).
        //19. Let valid be the result of IsCompatiblePropertyDescriptor(extensibleTarget, resultDesc, targetDesc).
        //20. If valid is false, then throw a TypeError exception.
        //21. If resultDesc.[[Configurable]] is false, then
        //a.If targetDesc is undefined or targetDesc.[[Configurable]] is true, then
        //i.Throw a TypeError exception.
        //22. Return resultDesc.

        // do not use "target" here, the trap may have caused it to change
        BOOL isTargetExtensible = targetObj->IsExtensible();
        BOOL toProperty = JavascriptOperators::ToPropertyDescriptor(getResult, resultDescriptor, requestContext);
        if (!toProperty && isTargetExtensible)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
        }

        JavascriptOperators::CompletePropertyDescriptor(resultDescriptor, nullptr, requestContext);
        if (!JavascriptOperators::IsCompatiblePropertyDescriptor(*resultDescriptor, hasProperty ? &targetDescriptor : nullptr, !!isTargetExtensible, true, requestContext))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
        }
        if (!resultDescriptor->IsConfigurable())
        {
            if (!hasProperty || targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }
        }
        resultDescriptor->SetFromProxy(true);
        return toProperty;
    }